

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool __thiscall asmjit::StringBuilder::eq(StringBuilder *this,char *str,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  
  __n = this->_length;
  if (len == 0xffffffffffffffff) {
    if (__n == 0) {
      __n = 0;
    }
    else {
      sVar2 = 0;
      do {
        if (this->_data[sVar2] != str[sVar2]) {
          return false;
        }
        if (str[sVar2] == '\0') {
          return false;
        }
        sVar2 = sVar2 + 1;
      } while (__n != sVar2);
    }
    bVar3 = str[__n] == '\0';
  }
  else if (__n == len) {
    iVar1 = bcmp(this->_data,str,__n);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool StringBuilder::eq(const char* str, size_t len) const noexcept {
  const char* aData = _data;
  const char* bData = str;

  size_t aLength = _length;
  size_t bLength = len;

  if (bLength == Globals::kInvalidIndex) {
    size_t i;
    for (i = 0; i < aLength; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aLength != bLength)
      return false;
    return ::memcmp(aData, bData, aLength) == 0;
  }
}